

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_set_from_euler_anglesf3(quaternion *self,float ax,float ay,float az)

{
  quaternion *pqVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar2 = (double)(az * 0.5);
  dVar3 = cos(dVar2);
  dVar4 = (double)(ay * 0.5);
  dVar5 = cos(dVar4);
  dVar6 = (double)(ax * 0.5);
  dVar7 = cos(dVar6);
  dVar8 = sin(dVar2);
  dVar9 = sin(dVar4);
  dVar10 = sin(dVar6);
  (self->field_0).q[3] =
       (float)dVar10 * (float)dVar9 * (float)dVar8 + (float)dVar7 * (float)dVar5 * (float)dVar3;
  dVar3 = cos(dVar2);
  dVar5 = cos(dVar4);
  dVar7 = sin(dVar6);
  dVar8 = sin(dVar2);
  dVar9 = sin(dVar4);
  dVar10 = cos(dVar6);
  (self->field_0).q[0] =
       (float)dVar7 * (float)dVar5 * (float)dVar3 - (float)dVar10 * (float)dVar9 * (float)dVar8;
  dVar3 = cos(dVar2);
  dVar5 = sin(dVar4);
  dVar7 = cos(dVar6);
  dVar8 = sin(dVar2);
  dVar9 = cos(dVar4);
  dVar10 = sin(dVar6);
  (self->field_0).q[1] =
       (float)dVar10 * (float)dVar9 * (float)dVar8 + (float)dVar7 * (float)dVar5 * (float)dVar3;
  dVar3 = sin(dVar2);
  dVar5 = cos(dVar4);
  dVar7 = cos(dVar6);
  dVar2 = cos(dVar2);
  dVar4 = sin(dVar4);
  dVar6 = sin(dVar6);
  (self->field_0).q[2] =
       (float)dVar7 * (float)dVar5 * (float)dVar3 - (float)dVar6 * (float)dVar4 * (float)dVar2;
  pqVar1 = quaternion_normalize(self);
  return pqVar1;
}

Assistant:

HYPAPI struct quaternion *quaternion_set_from_euler_anglesf3(struct quaternion *self, HYP_FLOAT ax, HYP_FLOAT ay, HYP_FLOAT az)
{
	self->w = HYP_COS(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_COS(ax / 2.0f) + HYP_SIN(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_SIN(ax / 2.0f);
	self->x = HYP_COS(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_SIN(ax / 2.0f) - HYP_SIN(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_COS(ax / 2.0f);
	self->y = HYP_COS(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_COS(ax / 2.0f) + HYP_SIN(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_SIN(ax / 2.0f);
	self->z = HYP_SIN(az / 2.0f) * HYP_COS(ay / 2.0f) * HYP_COS(ax / 2.0f) - HYP_COS(az / 2.0f) * HYP_SIN(ay / 2.0f) * HYP_SIN(ax / 2.0f);

	quaternion_normalize(self);

	return self;
}